

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall
tchecker::clockbounds::local_lu_map_t::local_lu_map_t
          (local_lu_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  allocator_type local_29;
  value_type local_28;
  
  (this->_L).
  super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_L).
  super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_loc_nb = 0;
  this->_clock_nb = 0;
  (this->_L).
  super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_U,0,&local_28,&local_29);
  resize(this,loc_nb,clock_nb);
  return;
}

Assistant:

local_lu_map_t::local_lu_map_t(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
    : _loc_nb(0), _clock_nb(0), _L(_loc_nb, nullptr), _U(_loc_nb, nullptr)
{
  resize(loc_nb, clock_nb);
}